

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<kj::(anonymous_namespace)::TestObject> * __thiscall
kj::ArrayBuilder<kj::(anonymous_namespace)::TestObject>::finish
          (Array<kj::(anonymous_namespace)::TestObject> *__return_storage_ptr__,
          ArrayBuilder<kj::(anonymous_namespace)::TestObject> *this)

{
  ArrayBuilder<kj::(anonymous_namespace)::TestObject> *this_local;
  Array<kj::(anonymous_namespace)::TestObject> *result;
  
  if (this->pos != this->endPtr) {
    _::inlineRequireFailure
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array.h"
               ,0x1d9,"pos == endPtr","\"ArrayBuilder::finish() called prematurely.\"",
               "ArrayBuilder::finish() called prematurely.");
  }
  Array<kj::(anonymous_namespace)::TestObject>::Array
            (__return_storage_ptr__,this->ptr,(long)this->pos - (long)this->ptr >> 2,this->disposer)
  ;
  this->ptr = (TestObject *)0x0;
  this->pos = (RemoveConst<kj::(anonymous_namespace)::TestObject> *)0x0;
  this->endPtr = (TestObject *)0x0;
  return __return_storage_ptr__;
}

Assistant:

Array<T> finish() {
    // We could safely remove this check if we assume that the disposer implementation doesn't
    // need to know the original capacity, as is the case with HeapArrayDisposer since it uses
    // operator new() or if we created a custom disposer for ArrayBuilder which stores the capacity
    // in a prefix.  But that would make it hard to write cleverer heap allocators, and anyway this
    // check might catch bugs.  Probably people should use Vector if they want to build arrays
    // without knowing the final size in advance.
    KJ_IREQUIRE(pos == endPtr, "ArrayBuilder::finish() called prematurely.");
    Array<T> result(reinterpret_cast<T*>(ptr), pos - ptr, *disposer);
    ptr = nullptr;
    pos = nullptr;
    endPtr = nullptr;
    return result;
  }